

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O2

SEQNUM __thiscall
FIX::MessageStoreExceptionWrapper::getNextTargetMsgSeqNum
          (MessageStoreExceptionWrapper *this,bool *threw,IOException *ex)

{
  SEQNUM SVar1;
  
  *threw = false;
  SVar1 = (**(code **)(**(long **)this + 0x28))();
  return SVar1;
}

Assistant:

SEQNUM MessageStoreExceptionWrapper::getNextTargetMsgSeqNum(bool &threw, IOException &ex) const {
  threw = false;
  try {
    return m_pStore->getNextTargetMsgSeqNum();
  } catch (IOException &e) {
    threw = true;
    ex = e;
    return 0;
  }
}